

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void AddCommandString(char *cmd,int keynum)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  DWaitingCommand *this;
  undefined4 in_register_00000034;
  size_t len;
  bool bVar4;
  int local_28;
  uint local_24;
  int tics;
  int more;
  char *brkpt;
  char *pcStack_10;
  int keynum_local;
  char *cmd_local;
  
  len = CONCAT44(in_register_00000034,keynum);
  pcStack_10 = cmd;
  if (cmd != (char *)0x0) {
    while (*pcStack_10 != '\0') {
      _tics = pcStack_10;
      while( true ) {
        bVar4 = false;
        if (*_tics != ';') {
          bVar4 = *_tics != '\0';
        }
        if (!bVar4) break;
        pcVar2 = _tics;
        if (*_tics == '\"') {
          do {
            _tics = pcVar2 + 1;
            bVar4 = false;
            if ((*_tics != '\0') && (bVar4 = true, *_tics == '\"')) {
              bVar4 = *pcVar2 == '\\';
            }
            pcVar2 = _tics;
          } while (bVar4);
        }
        if (*_tics != '\0') {
          _tics = _tics + 1;
        }
      }
      cVar1 = *_tics;
      if (cVar1 == ';') {
        *_tics = '\0';
      }
      local_24 = (uint)(cVar1 == ';');
      while( true ) {
        bVar4 = false;
        if (*pcStack_10 != '\0') {
          bVar4 = *pcStack_10 < '!';
        }
        if (!bVar4) break;
        pcStack_10 = pcStack_10 + 1;
      }
      if (*pcStack_10 != '\0') {
        if ((((((ParsingKeyConf & 1U) == 0) && (*pcStack_10 == 'w')) && (pcStack_10[1] == 'a')) &&
            ((pcStack_10[2] == 'i' && (pcStack_10[3] == 't')))) &&
           ((pcStack_10[4] == '\0' || (pcStack_10[4] == ' ')))) {
          if (pcStack_10[4] == ' ') {
            len = 0;
            lVar3 = strtol(pcStack_10 + 5,(char **)0x0,0);
            local_28 = (int)lVar3;
          }
          else {
            local_28 = 1;
          }
          if (0 < local_28) {
            if (local_24 == 0) {
              return;
            }
            *_tics = ';';
            this = (DWaitingCommand *)DObject::operator_new((DObject *)0x48,len);
            DWaitingCommand::DWaitingCommand(this,_tics,local_28);
            return;
          }
        }
        else {
          len = (size_t)(uint)keynum;
          C_DoCommand(pcStack_10,keynum);
        }
      }
      if (local_24 != 0) {
        *_tics = ';';
      }
      pcStack_10 = _tics + (int)local_24;
    }
  }
  return;
}

Assistant:

void AddCommandString (char *cmd, int keynum)
{
	char *brkpt;
	int more;

	if (cmd)
	{
		while (*cmd)
		{
			brkpt = cmd;
			while (*brkpt != ';' && *brkpt != '\0')
			{
				if (*brkpt == '\"')
				{
					brkpt++;
					while (*brkpt != '\0' && (*brkpt != '\"' || *(brkpt-1) == '\\'))
						brkpt++;
				}
				if (*brkpt != '\0')
					brkpt++;
			}
			if (*brkpt == ';')
			{
				*brkpt = '\0';
				more = 1;
			}
			else
			{
				more = 0;
			}
			// Intercept wait commands here. Note: wait must be lowercase
			while (*cmd && *cmd <= ' ')
				cmd++;
			if (*cmd)
			{
				if (!ParsingKeyConf &&
					cmd[0] == 'w' && cmd[1] == 'a' && cmd[2] == 'i' && cmd[3] == 't' &&
					(cmd[4] == 0 || cmd[4] == ' '))
				{
					int tics;

					if (cmd[4] == ' ')
					{
						tics = strtol (cmd + 5, NULL, 0);
					}
					else
					{
						tics = 1;
					}
					if (tics > 0)
					{
						if (more)
						{ // The remainder of the command will be executed later
						  // Note that deferred commands lose track of which key
						  // (if any) they were pressed from.
							*brkpt = ';';
							new DWaitingCommand (brkpt, tics);
						}
						return;
					}
				}
				else
				{
					C_DoCommand (cmd, keynum);
				}
			}
			if (more)
			{
				*brkpt = ';';
			}
			cmd = brkpt + more;
		}
	}
}